

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
embree::XMLLoader::loadFloatArray
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,XMLLoader *this,
          Ref<embree::XML> *xml)

{
  XML *this_00;
  bool bVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  float fVar4;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"ofs",&local_69);
    XML::parm(&local_48,this_00,&local_68);
    bVar1 = std::operator!=(&local_48,"");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      loadBinary<std::vector<float,std::allocator<float>>>(__return_storage_ptr__,this,xml);
    }
    else {
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::resize
                (__return_storage_ptr__,
                 ((long)(xml->ptr->body).
                        super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(xml->ptr->body).
                       super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x48);
      lVar3 = 0;
      for (uVar2 = 0;
          uVar2 < (ulong)((long)(__return_storage_ptr__->
                                super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
        fVar4 = Token::Float((Token *)((long)&((xml->ptr->body).
                                               super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ty +
                                      lVar3),true);
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar2] = fVar4;
        lVar3 = lVar3 + 0x48;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> XMLLoader::loadFloatArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<float>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<float>>(xml);
    } 
    else 
    {
      std::vector<float> data;
      data.resize(xml->body.size());
      for (size_t i=0; i<data.size(); i++) 
        data[i] = xml->body[i].Float();
      return data;
    }
  }